

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall File::output_binary(File *this,ofstream *out)

{
  Type TVar1;
  bool bVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  int *piVar6;
  double *pdVar7;
  u2 local_ca;
  reference pFStack_c8;
  u2 v_3;
  Function *fun;
  iterator __end1_1;
  iterator __begin1_1;
  vector<vm::Function,_std::allocator<vm::Function>_> *__range1_1;
  anon_class_8_1_5a786fbc aStack_a0;
  u2 functions_count;
  anon_class_8_1_5a786fbc to_binary;
  double_t v_2;
  int_t v_1;
  undefined2 local_7a;
  string local_78 [6];
  u2 len;
  string v;
  Constant *constant;
  iterator __end1;
  iterator __begin1;
  vector<vm::Constant,_std::allocator<vm::Constant>_> *__range1;
  undefined1 auStack_30 [6];
  u2 constants_count;
  anon_class_16_2_09cc686c writeNBytes;
  char bytes [8];
  ofstream *out_local;
  File *this_local;
  
  _auStack_30 = &writeNBytes.out;
  writeNBytes.bytes = (char (*) [8])out;
  std::ostream::write((char *)out,0x13b5d6);
  std::ostream::write((char *)out,0x13bdcd);
  sVar3 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::size(&this->constants);
  __range1._6_2_ = (undefined2)sVar3;
  output_binary::anon_class_16_2_09cc686c::operator()
            ((anon_class_16_2_09cc686c *)auStack_30,(void *)((long)&__range1 + 6),2);
  __end1 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::begin(&this->constants);
  constant = (Constant *)
             std::vector<vm::Constant,_std::allocator<vm::Constant>_>::end(&this->constants);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<vm::Constant_*,_std::vector<vm::Constant,_std::allocator<vm::Constant>_>_>
                                *)&constant);
    if (!bVar2) {
      aStack_a0.writeNBytes = (anon_class_16_2_09cc686c *)auStack_30;
      output_binary::anon_class_8_1_5a786fbc::operator()(&stack0xffffffffffffff60,&this->start);
      sVar3 = std::vector<vm::Function,_std::allocator<vm::Function>_>::size(&this->functions);
      __range1_1._6_2_ = (undefined2)sVar3;
      output_binary::anon_class_16_2_09cc686c::operator()
                ((anon_class_16_2_09cc686c *)auStack_30,(void *)((long)&__range1_1 + 6),2);
      __end1_1 = std::vector<vm::Function,_std::allocator<vm::Function>_>::begin(&this->functions);
      fun = (Function *)
            std::vector<vm::Function,_std::allocator<vm::Function>_>::end(&this->functions);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>
                            *)&fun);
        if (!bVar2) break;
        pFStack_c8 = __gnu_cxx::
                     __normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>
                     ::operator*(&__end1_1);
        local_ca = pFStack_c8->nameIndex;
        output_binary::anon_class_16_2_09cc686c::operator()
                  ((anon_class_16_2_09cc686c *)auStack_30,&local_ca,2);
        local_ca = pFStack_c8->paramSize;
        output_binary::anon_class_16_2_09cc686c::operator()
                  ((anon_class_16_2_09cc686c *)auStack_30,&local_ca,2);
        local_ca = pFStack_c8->level;
        output_binary::anon_class_16_2_09cc686c::operator()
                  ((anon_class_16_2_09cc686c *)auStack_30,&local_ca,2);
        output_binary::anon_class_8_1_5a786fbc::operator()
                  (&stack0xffffffffffffff60,&pFStack_c8->instructions);
        __gnu_cxx::
        __normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>
        ::operator++(&__end1_1);
      }
      return;
    }
    v.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<vm::Constant_*,_std::vector<vm::Constant,_std::allocator<vm::Constant>_>_>
         ::operator*(&__end1);
    TVar1 = ((reference)v.field_2._8_8_)->type;
    if (TVar1 == STRING) {
      std::ostream::write((char *)out,0x13bdd2);
      pbVar4 = std::get<std::__cxx11::string,std::__cxx11::string,int,double>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                           *)(v.field_2._8_8_ + 8));
      std::__cxx11::string::string(local_78,(string *)pbVar4);
      local_7a = std::__cxx11::string::length();
      output_binary::anon_class_16_2_09cc686c::operator()
                ((anon_class_16_2_09cc686c *)auStack_30,&local_7a,2);
      lVar5 = std::__cxx11::string::c_str();
      std::ostream::write((char *)out,lVar5);
      std::__cxx11::string::~string(local_78);
    }
    else if (TVar1 == INT) {
      std::ostream::write((char *)out,0x13b5db);
      piVar6 = std::get<int,std::__cxx11::string,int,double>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                           *)(v.field_2._8_8_ + 8));
      v_2._0_4_ = *piVar6;
      output_binary::anon_class_16_2_09cc686c::operator()
                ((anon_class_16_2_09cc686c *)auStack_30,&v_2,4);
    }
    else {
      if (TVar1 != DOUBLE) {
        __assert_fail("(\"unexpected error\", false)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/BUAA-SE-Compiling[P]c0-vm-cpp/src/file.cpp"
                      ,0x65,"void File::output_binary(std::ofstream &)");
      }
      std::ostream::write((char *)out,0x13b5dd);
      pdVar7 = std::get<double,std::__cxx11::string,int,double>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                           *)(v.field_2._8_8_ + 8));
      to_binary.writeNBytes = (anon_class_16_2_09cc686c *)*pdVar7;
      output_binary::anon_class_16_2_09cc686c::operator()
                ((anon_class_16_2_09cc686c *)auStack_30,&to_binary,8);
    }
    __gnu_cxx::
    __normal_iterator<vm::Constant_*,_std::vector<vm::Constant,_std::allocator<vm::Constant>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void File::output_binary(std::ofstream& out) {

    char bytes[8];
    const auto writeNBytes = [&](void* addr, int count) {
        assert(0 < count && count <= 8);
        char* p = reinterpret_cast<char*>(addr) + (count-1);
        for (int i = 0; i < count; ++i) {
            bytes[i] = *p--;
        }
        out.write(bytes, count);
    };

    // magic
    out.write("\x43\x30\x3A\x29", 4);
    // version
    out.write("\x00\x00\x00\x01", 4);
    // constants_count
    vm::u2 constants_count = constants.size();
    writeNBytes(&constants_count, sizeof constants_count);
    // constants
    for (auto& constant : constants) {
        switch (constant.type)
        {
        case vm::Constant::Type::STRING: {
            out.write("\x00", 1);
            std::string v = std::get<vm::str_t>(constant.value);
            vm::u2 len = v.length();
            writeNBytes(&len, sizeof len);
            out.write(v.c_str(), len);
        } break;
        case vm::Constant::Type::INT: {
            out.write("\x01", 1);
            vm::int_t v = std::get<vm::int_t>(constant.value);
            writeNBytes(&v, sizeof v);
        } break;
        case vm::Constant::Type::DOUBLE: {
            out.write("\x02", 1);
            vm::double_t v = std::get<vm::double_t>(constant.value);
            writeNBytes(&v, sizeof v);
        } break;
        default: assert(("unexpected error", false)); break;
        }
    }

    auto to_binary = [&](const std::vector<vm::Instruction>& v) {
        vm::u2 instructions_count = v.size();
        writeNBytes(&instructions_count, sizeof instructions_count);
        for (auto& ins : v) {
            vm::u1 op = static_cast<vm::u1>(ins.op); 
            writeNBytes(&op, sizeof op);
            if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
                auto paramSizes = it->second;
                switch (paramSizes[0]) {
                #define CASE(n) case n: { vm::u##n x = ins.x; writeNBytes(&x, n); }
                CASE(1); break; 
                CASE(2); break;
                CASE(4); break;
                #undef CASE
                default: assert(("unexpected error", false));
                }
                if (paramSizes.size() == 2) {
                    switch (paramSizes[1]) {
                    #define CASE(n) case n: { vm::u##n y = ins.y; writeNBytes(&y, n); }
                    CASE(1); break; 
                    CASE(2); break;
                    CASE(4); break;
                    #undef CASE
                    default: assert(("unexpected error", false));
                    }
                }
            }
        }
    };

    // start
    to_binary(start);
    // functions_count
    vm::u2 functions_count = functions.size();
    writeNBytes(&functions_count, sizeof functions_count);
    // functions
    for (auto& fun : functions) {
        vm::u2 v;
        v = fun.nameIndex; writeNBytes(&v, sizeof v);
        v = fun.paramSize; writeNBytes(&v, sizeof v);
        v = fun.level;     writeNBytes(&v, sizeof v);
        to_binary(fun.instructions);
    }
}